

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ecdsa_impl.h
# Opt level: O3

int secp256k1_ecdsa_sig_sign
              (secp256k1_ecmult_gen_context *ctx,secp256k1_scalar *sigr,secp256k1_scalar *sigs,
              secp256k1_scalar *seckey,secp256k1_scalar *message,secp256k1_scalar *nonce,int *recid)

{
  uint uVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  undefined1 auVar5 [16];
  secp256k1_ge r;
  secp256k1_scalar n;
  uchar b [32];
  secp256k1_gej rp;
  int local_16c;
  secp256k1_scalar *local_168;
  secp256k1_scalar *local_160;
  secp256k1_ge local_158;
  secp256k1_scalar local_f8;
  uchar local_d8 [32];
  secp256k1_gej local_b8;
  
  local_16c = 0;
  local_168 = seckey;
  local_160 = message;
  secp256k1_ecmult_gen(ctx,&local_b8,nonce);
  secp256k1_ge_set_gej(&local_158,&local_b8);
  secp256k1_fe_impl_normalize(&local_158.x);
  secp256k1_fe_impl_normalize(&local_158.y);
  secp256k1_fe_impl_get_b32(local_d8,&local_158.x);
  secp256k1_scalar_set_b32(sigr,local_d8,&local_16c);
  if (recid != (int *)0x0) {
    *recid = ((uint)local_158.y.n[0] & 1) + local_16c * 2;
  }
  secp256k1_scalar_mul(&local_f8,sigr,local_168);
  secp256k1_scalar_add(&local_f8,&local_f8,local_160);
  secp256k1_scalar_inverse(sigs,nonce);
  secp256k1_scalar_mul(sigs,sigs,&local_f8);
  local_f8.d[2] = 0;
  local_f8.d[3] = 0;
  local_f8.d[0] = 0;
  local_f8.d[1] = 0;
  local_b8.z.n[4] = 0;
  local_b8.infinity = 0;
  local_b8._124_4_ = 0;
  local_b8.z.n[2] = 0;
  local_b8.z.n[3] = 0;
  local_b8.z.n[0] = 0;
  local_b8.z.n[1] = 0;
  local_b8.y.n[3] = 0;
  local_b8.y.n[4] = 0;
  local_b8.y.n[1] = 0;
  local_b8.y.n[2] = 0;
  local_b8.x.n[4] = 0;
  local_b8.y.n[0] = 0;
  local_b8.x.n[2] = 0;
  local_b8.x.n[3] = 0;
  local_b8.x.n[0] = 0;
  local_b8.x.n[1] = 0;
  local_158.y.n[3] = 0;
  local_158.y.n[4] = 0;
  local_158.y.n[1] = 0;
  local_158.y.n[2] = 0;
  local_158.x.n[4] = 0;
  local_158.y.n[0] = 0;
  local_158.x.n[2] = 0;
  local_158.x.n[3] = 0;
  local_158.x.n[0] = 0;
  local_158.x.n[1] = 0;
  local_158.infinity = 0;
  local_158._84_4_ = 0;
  uVar1 = (uint)(sigs->d[3] >> 0x3f);
  uVar2 = uVar1 ^ 1;
  uVar4 = uVar2;
  if (sigs->d[2] == 0xffffffffffffffff) {
    uVar4 = 0;
  }
  if (0x5d576e7357a4501c < sigs->d[1]) {
    uVar2 = 0;
  }
  uVar2 = (uVar2 | uVar4 | sigs->d[3] < 0x7fffffffffffffff) ^ 1;
  uVar4 = 0;
  if (0xdfe92f46681b20a0 < sigs->d[0]) {
    uVar4 = uVar2;
  }
  if (0x5d576e7357a4501d < sigs->d[1]) {
    uVar4 = uVar2;
  }
  uVar4 = uVar4 | uVar1;
  secp256k1_scalar_cond_negate(sigs,uVar4);
  if (recid != (int *)0x0) {
    *recid = *recid ^ uVar4;
  }
  auVar5._0_4_ = -(uint)((int)sigs->d[2] == 0 && (int)sigs->d[0] == 0);
  auVar5._4_4_ = -(uint)(*(int *)((long)sigs->d + 0x14) == 0 && *(int *)((long)sigs->d + 4) == 0);
  auVar5._8_4_ = -(uint)((int)sigs->d[3] == 0 && (int)sigs->d[1] == 0);
  auVar5._12_4_ = -(uint)(*(int *)((long)sigs->d + 0x1c) == 0 && *(int *)((long)sigs->d + 0xc) == 0)
  ;
  iVar3 = movmskps(uVar2,auVar5);
  return (int)(iVar3 != 0xf &&
              ((sigr->d[3] != 0 || sigr->d[1] != 0) || (sigr->d[2] != 0 || sigr->d[0] != 0)));
}

Assistant:

static int secp256k1_ecdsa_sig_sign(const secp256k1_ecmult_gen_context *ctx, secp256k1_scalar *sigr, secp256k1_scalar *sigs, const secp256k1_scalar *seckey, const secp256k1_scalar *message, const secp256k1_scalar *nonce, int *recid) {
    unsigned char b[32];
    secp256k1_gej rp;
    secp256k1_ge r;
    secp256k1_scalar n;
    int overflow = 0;
    int high;

    secp256k1_ecmult_gen(ctx, &rp, nonce);
    secp256k1_ge_set_gej(&r, &rp);
    secp256k1_fe_normalize(&r.x);
    secp256k1_fe_normalize(&r.y);
    secp256k1_fe_get_b32(b, &r.x);
    secp256k1_scalar_set_b32(sigr, b, &overflow);
    if (recid) {
        /* The overflow condition is cryptographically unreachable as hitting it requires finding the discrete log
         * of some P where P.x >= order, and only 1 in about 2^127 points meet this criteria.
         */
        *recid = (overflow << 1) | secp256k1_fe_is_odd(&r.y);
    }
    secp256k1_scalar_mul(&n, sigr, seckey);
    secp256k1_scalar_add(&n, &n, message);
    secp256k1_scalar_inverse(sigs, nonce);
    secp256k1_scalar_mul(sigs, sigs, &n);
    secp256k1_scalar_clear(&n);
    secp256k1_gej_clear(&rp);
    secp256k1_ge_clear(&r);
    high = secp256k1_scalar_is_high(sigs);
    secp256k1_scalar_cond_negate(sigs, high);
    if (recid) {
        *recid ^= high;
    }
    /* P.x = order is on the curve, so technically sig->r could end up being zero, which would be an invalid signature.
     * This is cryptographically unreachable as hitting it requires finding the discrete log of P.x = N.
     */
    return (int)(!secp256k1_scalar_is_zero(sigr)) & (int)(!secp256k1_scalar_is_zero(sigs));
}